

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O3

int onig_st_insert(st_table *table,st_data_t key,st_data_t value)

{
  st_table_entry **ppsVar1;
  st_table_entry *psVar2;
  uint uVar3;
  int iVar4;
  st_table_entry *psVar5;
  ulong uVar6;
  
  uVar3 = (*table->type->hash)(key);
  uVar6 = (ulong)uVar3 % (ulong)(uint)table->num_bins;
  psVar5 = table->bins[uVar6];
  if (psVar5 != (st_table_entry *)0x0) {
    if ((psVar5->hash == uVar3) &&
       ((psVar5->key == key || (iVar4 = (*table->type->compare)(key,psVar5->key), iVar4 == 0)))) {
LAB_0012bb00:
      psVar5->record = value;
      return 1;
    }
    psVar2 = psVar5;
    for (psVar5 = psVar5->next; psVar5 != (st_table_entry *)0x0; psVar5 = psVar5->next) {
      if (psVar5->hash == uVar3) {
        if (psVar5->key == key) goto LAB_0012bb00;
        iVar4 = (*table->type->compare)(key,psVar5->key);
        psVar5 = psVar2->next;
        if (iVar4 == 0) {
          if (psVar5 != (st_table_entry *)0x0) goto LAB_0012bb00;
          break;
        }
      }
      psVar2 = psVar5;
    }
  }
  if (5 < table->num_entries / table->num_bins) {
    rehash(table);
    uVar6 = (ulong)uVar3 % (ulong)(uint)table->num_bins;
  }
  psVar5 = (st_table_entry *)malloc(0x20);
  if (psVar5 == (st_table_entry *)0x0) {
    iVar4 = -5;
  }
  else {
    psVar5->hash = uVar3;
    psVar5->key = key;
    psVar5->record = value;
    ppsVar1 = table->bins;
    psVar5->next = ppsVar1[uVar6];
    ppsVar1[uVar6] = psVar5;
    table->num_entries = table->num_entries + 1;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

extern int
st_insert(register st_table* table, register st_data_t key, st_data_t value)
{
  unsigned int hash_val, bin_pos;
  register st_table_entry *ptr;

  hash_val = do_hash(key, table);
  FIND_ENTRY(table, ptr, hash_val, bin_pos);

  if (ptr == 0) {
    ADD_DIRECT(table, key, value, hash_val, bin_pos, ONIGERR_MEMORY);
    return 0;
  }
  else {
    ptr->record = value;
    return 1;
  }
}